

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

string * __thiscall
cmFindLibraryCommand::FindLibrary_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkFirst != false) ||
     ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly == true)) {
    FindFrameworkLibrary_abi_cxx11_(&sStack_38,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly == false) {
    FindNormalLibrary_abi_cxx11_(&sStack_38,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkLast == true) {
    FindFrameworkLibrary_abi_cxx11_(&sStack_38,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindLibrary()
{
  std::string library;
  if(this->SearchFrameworkFirst || this->SearchFrameworkOnly)
    {
    library = this->FindFrameworkLibrary();
    }
  if(library.empty() && !this->SearchFrameworkOnly)
    {
    library = this->FindNormalLibrary();
    }
  if(library.empty() && this->SearchFrameworkLast)
    {
    library = this->FindFrameworkLibrary();
    }
  return library;
}